

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simulator.cpp
# Opt level: O0

Value __thiscall lsim::Simulator::read_pin_current_step(Simulator *this,pin_t pin)

{
  Value VVar1;
  size_type sVar2;
  const_reference pvVar3;
  value_type node_id;
  pin_t pin_local;
  Simulator *this_local;
  
  sVar2 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(&this->m_pin_nodes);
  if (pin < sVar2) {
    pvVar3 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                       (&this->m_pin_nodes,(ulong)pin);
    VVar1 = read_node_current_step(this,*pvVar3);
    return VVar1;
  }
  __assert_fail("pin < m_pin_nodes.size()",
                "/workspace/llm4binary/github/license_c_cmakelists/JohanSmet[P]lsim/src/simulator.cpp"
                ,100,"Value lsim::Simulator::read_pin_current_step(pin_t) const");
}

Assistant:

Value Simulator::read_pin_current_step(pin_t pin) const {
    assert(pin < m_pin_nodes.size());

    auto node_id = m_pin_nodes[pin];
    return read_node_current_step(node_id);
}